

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightParameters.cpp
# Opt level: O0

void __thiscall OpenMD::Perturbations::LightParameters::LightParameters(LightParameters *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __a;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar1;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  DataHolder *in_stack_fffffffffffffa70;
  value_type *in_stack_fffffffffffffa78;
  value_type *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffffa80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_3e9 [80];
  allocator<char> local_399;
  string local_398 [32];
  _Base_ptr local_378;
  undefined1 local_370;
  undefined8 *local_368;
  undefined1 local_359 [80];
  allocator<char> local_309;
  string local_308 [32];
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  undefined8 *local_2d8;
  allocator<char> local_2c9;
  string local_2c8 [79];
  allocator<char> local_279;
  string local_278 [32];
  _Base_ptr local_258;
  undefined1 local_250;
  undefined8 *local_248;
  allocator<char> local_239;
  string local_238 [79];
  allocator<char> local_1e9;
  string local_1e8 [32];
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  undefined8 *local_1b8;
  allocator<char> local_1a9;
  string local_1a8 [79];
  allocator<char> local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  undefined8 *local_128;
  allocator<char> local_119;
  string local_118 [79];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [78];
  bool local_3a;
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder(in_stack_fffffffffffffa70);
  *in_RDI = &PTR__LightParameters_005244c0;
  Parameter<bool>::Parameter((Parameter<bool> *)in_stack_fffffffffffffa70);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffffa70);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffffa70);
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)in_stack_fffffffffffffa70);
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)in_stack_fffffffffffffa70);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffffa70);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffa70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd),true);
  local_3a = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0xd),&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffa80,&in_stack_fffffffffffffa78->first,
             (ParameterBase **)in_stack_fffffffffffffa70);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_a8 = (_Base_ptr)pVar1.first._M_node;
  local_a0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31a36b);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x13),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  local_128 = in_RDI + 0x13;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffa80,&in_stack_fffffffffffffa78->first,
             (ParameterBase **)in_stack_fffffffffffffa70);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_138 = (_Base_ptr)pVar1.first._M_node;
  local_130 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31a4e7);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x1a),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  local_1b8 = in_RDI + 0x1a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffa80,&in_stack_fffffffffffffa78->first,
             (ParameterBase **)in_stack_fffffffffffffa70);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_1c8 = (_Base_ptr)pVar1.first._M_node;
  local_1c0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31a663);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x21),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  local_248 = in_RDI + 0x21;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffa80,&in_stack_fffffffffffffa78->first,
             (ParameterBase **)in_stack_fffffffffffffa70);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_258 = (_Base_ptr)pVar1.first._M_node;
  local_250 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31a7df);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x2a),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  local_2d8 = in_RDI + 0x2a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffa80,&in_stack_fffffffffffffa78->first,
             (ParameterBase **)in_stack_fffffffffffffa70);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_2e8 = (_Base_ptr)pVar1.first._M_node;
  local_2e0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31a943);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x33),true);
  __s = (char *)(in_RDI + 1);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_359;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffffaa0);
  local_368 = in_RDI + 0x33;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffffa80,&in_stack_fffffffffffffa78->first,
             (ParameterBase **)in_stack_fffffffffffffa70);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  __a = pVar1.first._M_node;
  local_370 = pVar1.second;
  local_378 = __a._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31aa9b);
  std::__cxx11::string::~string((string *)(local_359 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffffa70,
             (string *)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x3a),true);
  __x = (value_type *)(in_RDI + 1);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&__x->first,(ParameterBase **)in_stack_fffffffffffffa70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,__x);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x31abf3);
  std::__cxx11::string::~string((string *)(local_3e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3e9);
  return;
}

Assistant:

LightParameters::LightParameters() {
    DefineOptionalParameterWithDefaultValue(UseLight, "useLight", false);
    DefineOptionalParameter(Wavelength, "wavelength");
    DefineOptionalParameter(Frequency, "frequency");
    DefineOptionalParameter(PropagationDirection, "propagationDirection");
    DefineOptionalParameter(WaveVector, "waveVector");
    DefineOptionalParameter(Intensity, "intensity");
    DefineOptionalParameter(Polarization, "polarization");
  }